

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode post_per_transfer(GlobalConfig *global,per_transfer *per,CURLcode result,_Bool *retryp,
                          long *delay)

{
  GlobalConfig *config_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  FILE *pFVar6;
  OperationConfig *curl_00;
  CURLcode CVar7;
  _Bool _Var8;
  int iVar9;
  int *piVar10;
  char *pcVar11;
  timediff_t tVar12;
  char *pcVar13;
  curltime cVar14;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  char *local_180;
  curl_off_t local_168;
  curl_off_t filetime;
  stat st;
  curl_off_t seconds;
  curl_off_t retry_after;
  long sleeptime;
  char *scheme_1;
  char *scheme;
  long oserrno;
  long response;
  time_t tStack_80;
  anon_enum_32 retry;
  int local_78;
  long local_70;
  long cond_unmet;
  long code;
  char *msg;
  OperationConfig *pOStack_50;
  int rc;
  OperationConfig *config;
  CURL *curl;
  OutStruct *outs;
  long *delay_local;
  _Bool *retryp_local;
  per_transfer *ppStack_20;
  CURLcode result_local;
  per_transfer *per_local;
  GlobalConfig *global_local;
  
  curl = &per->outs;
  config = (OperationConfig *)per->curl;
  pOStack_50 = per->config;
  *retryp = false;
  *delay = 0;
  if (config == (OperationConfig *)0x0) {
    return result;
  }
  if (pOStack_50 == (OperationConfig *)0x0) {
    return result;
  }
  outs = (OutStruct *)delay;
  delay_local = (long *)retryp;
  retryp_local._4_4_ = result;
  ppStack_20 = per;
  per_local = (per_transfer *)global;
  if ((per->field_0x1d8 & 1) != 0) {
    close(per->infd);
  }
  CVar7 = retryp_local._4_4_;
  pFVar6 = tool_stderr;
  if (((byte)ppStack_20->field_0x1d8 >> 5 & 1) != 0) goto LAB_0011b003;
  if ((((*(uint *)&pOStack_50->field_0x4ec >> 0x10 & 1) == 0) && (retryp_local._4_4_ != CURLE_OK))
     && (((*(ushort *)((long)&(per_local->retrystart).tv_usec + 3) >> 8 & 1) == 0 ||
         ((*(ushort *)((long)&(per_local->retrystart).tv_usec + 3) >> 7 & 1) != 0)))) {
    local_180 = ppStack_20->errorbuffer;
    code = (long)local_180;
    if ((local_180 == (char *)0x0) || (*local_180 == '\0')) {
      local_180 = (char *)curl_easy_strerror(retryp_local._4_4_);
    }
    curl_mfprintf(pFVar6,"curl: (%d) %s\n",CVar7,local_180);
    if (retryp_local._4_4_ == CURLE_PEER_FAILED_VERIFICATION) {
      fputs("More details here: https://curl.se/docs/sslcerts.html\n\ncurl failed to verify the legitimacy of the server and therefore could not\nestablish a secure connection to it. To learn more about this situation and\nhow to fix it, please visit the webpage mentioned above.\n"
            ,(FILE *)tool_stderr);
    }
  }
  else if ((*(ulong *)&pOStack_50->field_0x4e4 >> 0x12 & 1) != 0) {
    cond_unmet = 0;
    curl_easy_getinfo(config,0x200002,&cond_unmet);
    if (399 < cond_unmet) {
      if (((*(ushort *)((long)&(per_local->retrystart).tv_usec + 3) >> 8 & 1) == 0) ||
         ((*(ushort *)((long)&(per_local->retrystart).tv_usec + 3) >> 7 & 1) != 0)) {
        curl_mfprintf(tool_stderr,"curl: (%d) The requested URL returned error: %ld\n",0x16,
                      cond_unmet);
      }
      retryp_local._4_4_ = CURLE_HTTP_RETURNED_ERROR;
    }
  }
  curl_00 = config;
  if ((((retryp_local._4_4_ == CURLE_OK) && ((*(uint *)&pOStack_50->field_0x4ec >> 1 & 1) != 0)) &&
      ((*(byte *)((long)curl + 8) >> 3 & 1) != 0)) && (*(long *)((long)curl + 0x10) != 0)) {
    pcVar11 = ppStack_20->url;
    iVar9 = fileno(*(FILE **)((long)curl + 0x10));
    msg._4_4_ = fwrite_xattr(curl_00,pcVar11,iVar9);
    if (msg._4_4_ != 0) {
      config_00 = pOStack_50->global;
      uVar1 = *curl;
      piVar10 = __errno_location();
      pcVar11 = strerror(*piVar10);
      warnf(config_00,"Error setting extended attributes on \'%s\': %s",uVar1,pcVar11);
    }
  }
  if (((retryp_local._4_4_ == CURLE_OK) && (*(long *)((long)curl + 0x10) == 0)) &&
     (*(long *)((long)curl + 0x18) == 0)) {
    local_70 = 0;
    curl_easy_getinfo(config,0x200023,&local_70);
    if ((local_70 == 0) && (_Var8 = tool_create_output_file((OutStruct *)curl,pOStack_50), !_Var8))
    {
      retryp_local._4_4_ = CURLE_WRITE_ERROR;
    }
  }
  if (((((*(byte *)((long)curl + 8) >> 2 & 1) == 0) && (*(long *)((long)curl + 0x10) != 0)) &&
      (msg._4_4_ = fflush(*(FILE **)((long)curl + 0x10)), retryp_local._4_4_ == CURLE_OK)) &&
     (msg._4_4_ != 0)) {
    retryp_local._4_4_ = CURLE_WRITE_ERROR;
    errorf((GlobalConfig *)per_local,"Failed writing body");
  }
  if (ppStack_20->retry_remaining != 0) {
    if (pOStack_50->retry_maxtime != 0) {
      cVar14 = curlx_now();
      tStack_80 = cVar14.tv_sec;
      local_78 = cVar14.tv_usec;
      uVar2 = (ppStack_20->retrystart).tv_sec;
      uVar3 = (ppStack_20->retrystart).tv_usec;
      older.tv_usec = uVar3;
      older.tv_sec = uVar2;
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar14._0_12_,0);
      newer.tv_usec = SUB124(cVar14._0_12_,8);
      older._12_4_ = 0;
      tVar12 = curlx_timediff(newer,older);
      if (SBORROW8(tVar12,pOStack_50->retry_maxtime * 1000) ==
          tVar12 + pOStack_50->retry_maxtime * -1000 < 0) goto LAB_0011ae4b;
    }
    response._4_4_ = 0;
    oserrno = 0;
    if (((retryp_local._4_4_ == CURLE_OPERATION_TIMEDOUT) ||
        (retryp_local._4_4_ == CURLE_COULDNT_RESOLVE_HOST)) ||
       ((retryp_local._4_4_ == CURLE_COULDNT_RESOLVE_PROXY ||
        (retryp_local._4_4_ == CURLE_FTP_ACCEPT_TIMEOUT)))) {
      response._4_4_ = 2;
    }
    else if ((((uint)((ulong)*(undefined8 *)&pOStack_50->field_0x4e4 >> 0x37) & 1) == 0) ||
            (retryp_local._4_4_ != CURLE_COULDNT_CONNECT)) {
      if ((retryp_local._4_4_ == CURLE_OK) ||
         ((((*(ulong *)&pOStack_50->field_0x4e4 >> 0x11 & 1) != 0 ||
           ((*(ulong *)&pOStack_50->field_0x4e4 >> 0x12 & 1) != 0)) &&
          (retryp_local._4_4_ == CURLE_HTTP_RETURNED_ERROR)))) {
        curl_easy_getinfo(config,0x100031,&scheme_1);
        scheme_1 = proto_token(scheme_1);
        if (((scheme_1 == proto_http) || (scheme_1 == proto_https)) &&
           ((curl_easy_getinfo(config,0x200002,&oserrno), oserrno == 0x198 ||
            (((oserrno == 0x1ad || (oserrno == 500)) || (oserrno - 0x1f6U < 3)))))) {
          response._4_4_ = 4;
        }
      }
      else if (retryp_local._4_4_ != CURLE_OK) {
        curl_easy_getinfo(config,0x200002,&oserrno);
        curl_easy_getinfo(config,0x100031,&sleeptime);
        sleeptime = (long)proto_token((char *)sleeptime);
        if ((((char *)sleeptime == proto_ftp) || ((char *)sleeptime == proto_ftps)) &&
           (oserrno / 100 == 4)) {
          response._4_4_ = 5;
        }
      }
    }
    else {
      scheme = (char *)0x0;
      curl_easy_getinfo(config,0x200019,&scheme);
      if (scheme == (char *)0x6f) {
        response._4_4_ = 3;
      }
    }
    if (((retryp_local._4_4_ != CURLE_OK) && (response._4_4_ == 0)) &&
       ((*(ulong *)&pOStack_50->field_0x4e4 >> 0x36 & 1) != 0)) {
      response._4_4_ = 1;
    }
    if (response._4_4_ != 0) {
      seconds = 0;
      retry_after = ppStack_20->retry_sleep;
      if ((response._4_4_ != 4) || (curl_easy_getinfo(config,0x600039,&seconds), seconds == 0)) {
LAB_0011ac3e:
        pcVar11 = "s";
        if (retry_after / 1000 == 1) {
          pcVar11 = "";
        }
        pcVar13 = "y";
        if (1 < ppStack_20->retry_remaining) {
          pcVar13 = "ies";
        }
        warnf(pOStack_50->global,"Problem %s. Will retry in %ld second%s. %ld retr%s left.",
              post_per_transfer::m[response._4_4_],retry_after / 1000,pcVar11,
              ppStack_20->retry_remaining,pcVar13);
        ppStack_20->retry_remaining = ppStack_20->retry_remaining + -1;
        if ((pOStack_50->retry_delay == 0) &&
           (ppStack_20->retry_sleep = ppStack_20->retry_sleep << 1, 600000 < ppStack_20->retry_sleep
           )) {
          ppStack_20->retry_sleep = 600000;
        }
        if (((*(long *)((long)curl + 0x18) != 0) && (*curl != 0)) &&
           (*(long *)((long)curl + 0x10) != 0)) {
          notef(pOStack_50->global,"Throwing away %ld bytes",*(undefined8 *)((long)curl + 0x18));
          fflush(*(FILE **)((long)curl + 0x10));
          iVar9 = fileno(*(FILE **)((long)curl + 0x10));
          iVar9 = ftruncate64(iVar9,*(__off64_t *)((long)curl + 0x20));
          if (iVar9 != 0) {
            errorf(pOStack_50->global,"Failed to truncate file");
            return CURLE_WRITE_ERROR;
          }
          msg._4_4_ = fseek(*(FILE **)((long)curl + 0x10),0,2);
          if (msg._4_4_ != 0) {
            errorf(pOStack_50->global,"Failed seeking to end of file");
            return CURLE_WRITE_ERROR;
          }
          *(undefined8 *)((long)curl + 0x18) = 0;
        }
        *(undefined1 *)delay_local = 1;
        ppStack_20->num_retries = ppStack_20->num_retries + 1;
        outs->filename = (char *)retry_after;
        return CURLE_OK;
      }
      if (seconds < 0x20c49ba5e353f8) {
        if (seconds * 1000 - retry_after != 0 && retry_after <= seconds * 1000) {
          retry_after = seconds * 1000;
        }
      }
      else {
        retry_after = 0x7fffffffffffffff;
      }
      if (pOStack_50->retry_maxtime == 0) goto LAB_0011ac3e;
      cVar14 = curlx_now();
      st.__glibc_reserved[2] = cVar14.tv_sec;
      uVar4 = (ppStack_20->retrystart).tv_sec;
      uVar5 = (ppStack_20->retrystart).tv_usec;
      older_00.tv_usec = uVar5;
      older_00.tv_sec = uVar4;
      newer_00._12_4_ = 0;
      newer_00.tv_sec = SUB128(cVar14._0_12_,0);
      newer_00.tv_usec = SUB124(cVar14._0_12_,8);
      older_00._12_4_ = 0;
      tVar12 = curlx_timediff(newer_00,older_00);
      if ((tVar12 / 1000 <= 0x7fffffffffffffff - seconds) &&
         (tVar12 / 1000 + seconds <= pOStack_50->retry_maxtime)) goto LAB_0011ac3e;
      warnf(pOStack_50->global,
            "The Retry-After: time would make this command line exceed the maximum allowed time for retries."
            ,tVar12 % 1000);
    }
  }
LAB_0011ae4b:
  if ((*(int *)((long)&(per_local->retrystart).tv_sec + 4) == 1) &&
     ((ppStack_20->progressbar).calls != 0)) {
    fputs("\n",(FILE *)(ppStack_20->progressbar).out);
  }
  if (((*(byte *)((long)curl + 8) >> 3 & 1) != 0) && (*(long *)((long)curl + 0x10) != 0)) {
    msg._4_4_ = fclose(*(FILE **)((long)curl + 0x10));
    if ((retryp_local._4_4_ == CURLE_OK) && (msg._4_4_ != 0)) {
      retryp_local._4_4_ = CURLE_WRITE_ERROR;
      errorf(pOStack_50->global,"curl: (%d) Failed writing body",0x17);
    }
    if ((retryp_local._4_4_ != CURLE_OK) && ((*(uint *)&pOStack_50->field_0x4ec >> 0x15 & 1) != 0))
    {
      iVar9 = stat64(*curl,(stat64 *)&filetime);
      if ((iVar9 == 0) && (((uint)st.st_nlink & 0xf000) == 0x8000)) {
        iVar9 = unlink(*curl);
        if (iVar9 == 0) {
          notef((GlobalConfig *)per_local,"Removed output file: %s",*curl);
        }
        else {
          warnf((GlobalConfig *)per_local,"Failed removing: %s",*curl);
        }
      }
      else {
        warnf((GlobalConfig *)per_local,"Skipping removal; not a regular file: %s",*curl);
      }
    }
  }
  if ((((retryp_local._4_4_ == CURLE_OK) && ((*(ulong *)&pOStack_50->field_0x4e4 & 1) != 0)) &&
      ((*(byte *)((long)curl + 8) >> 2 & 1) != 0)) && (*curl != 0)) {
    local_168 = -1;
    curl_easy_getinfo(config,0x60000e,&local_168);
    setfiletime(local_168,*curl,(GlobalConfig *)per_local);
  }
LAB_0011b003:
  if (pOStack_50->writeout != (char *)0x0) {
    ourWriteOut(pOStack_50,ppStack_20,retryp_local._4_4_);
  }
  if ((((byte)(ppStack_20->heads).field_0x8 >> 3 & 1) != 0) &&
     ((ppStack_20->heads).stream != (FILE *)0x0)) {
    fclose((FILE *)(ppStack_20->heads).stream);
  }
  if (((ppStack_20->heads).field_0x8 & 1) != 0) {
    free((ppStack_20->heads).filename);
    (ppStack_20->heads).filename = (char *)0x0;
  }
  if ((((byte)(ppStack_20->etag_save).field_0x8 >> 3 & 1) != 0) &&
     ((ppStack_20->etag_save).stream != (FILE *)0x0)) {
    fclose((FILE *)(ppStack_20->etag_save).stream);
  }
  if (((ppStack_20->etag_save).field_0x8 & 1) != 0) {
    free((ppStack_20->etag_save).filename);
    (ppStack_20->etag_save).filename = (char *)0x0;
  }
  curl_easy_cleanup(ppStack_20->curl);
  if ((*(byte *)((long)curl + 8) & 1) != 0) {
    free(*curl);
  }
  free(ppStack_20->url);
  free(ppStack_20->outfile);
  free(ppStack_20->uploadfile);
  if ((*(ushort *)((long)&(per_local->retrystart).tv_usec + 3) & 1) != 0) {
    free(ppStack_20->errorbuffer);
  }
  curl_slist_free_all((ppStack_20->hdrcbdata).headlist);
  (ppStack_20->hdrcbdata).headlist = (curl_slist *)0x0;
  return retryp_local._4_4_;
}

Assistant:

static CURLcode post_per_transfer(struct GlobalConfig *global,
                                  struct per_transfer *per,
                                  CURLcode result,
                                  bool *retryp,
                                  long *delay) /* milliseconds! */
{
  struct OutStruct *outs = &per->outs;
  CURL *curl = per->curl;
  struct OperationConfig *config = per->config;
  int rc;

  *retryp = FALSE;
  *delay = 0; /* for no retry, keep it zero */

  if(!curl || !config)
    return result;

  if(per->infdopen)
    close(per->infd);

  if(per->skip)
    goto skip;

#ifdef __VMS
  if(is_vms_shell()) {
    /* VMS DCL shell behavior */
    if(global->silent && !global->showerror)
      vms_show = VMSSTS_HIDE;
  }
  else
#endif
    if(!config->synthetic_error && result &&
       (!global->silent || global->showerror)) {
      const char *msg = per->errorbuffer;
      fprintf(tool_stderr, "curl: (%d) %s\n", result,
              (msg && msg[0]) ? msg : curl_easy_strerror(result));
      if(result == CURLE_PEER_FAILED_VERIFICATION)
        fputs(CURL_CA_CERT_ERRORMSG, tool_stderr);
    }
    else if(config->failwithbody) {
      /* if HTTP response >= 400, return error */
      long code = 0;
      curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &code);
      if(code >= 400) {
        if(!global->silent || global->showerror)
          fprintf(tool_stderr,
                  "curl: (%d) The requested URL returned error: %ld\n",
                  CURLE_HTTP_RETURNED_ERROR, code);
        result = CURLE_HTTP_RETURNED_ERROR;
      }
    }
  /* Set file extended attributes */
  if(!result && config->xattr && outs->fopened && outs->stream) {
    rc = fwrite_xattr(curl, per->url, fileno(outs->stream));
    if(rc)
      warnf(config->global, "Error setting extended attributes on '%s': %s",
            outs->filename, strerror(errno));
  }

  if(!result && !outs->stream && !outs->bytes) {
    /* we have received no data despite the transfer was successful
       ==> force creation of an empty output file (if an output file
       was specified) */
    long cond_unmet = 0L;
    /* do not create (or even overwrite) the file in case we get no
       data because of unmet condition */
    curl_easy_getinfo(curl, CURLINFO_CONDITION_UNMET, &cond_unmet);
    if(!cond_unmet && !tool_create_output_file(outs, config))
      result = CURLE_WRITE_ERROR;
  }

  if(!outs->s_isreg && outs->stream) {
    /* Dump standard stream buffered data */
    rc = fflush(outs->stream);
    if(!result && rc) {
      /* something went wrong in the writing process */
      result = CURLE_WRITE_ERROR;
      errorf(global, "Failed writing body");
    }
  }

#ifdef _WIN32
  /* Discard incomplete UTF-8 sequence buffered from body */
  if(outs->utf8seq[0])
    memset(outs->utf8seq, 0, sizeof(outs->utf8seq));
#endif

  /* if retry-max-time is non-zero, make sure we have not exceeded the
     time */
  if(per->retry_remaining &&
     (!config->retry_maxtime ||
      (curlx_timediff(curlx_now(), per->retrystart) <
       config->retry_maxtime*1000L)) ) {
    enum {
      RETRY_NO,
      RETRY_ALL_ERRORS,
      RETRY_TIMEOUT,
      RETRY_CONNREFUSED,
      RETRY_HTTP,
      RETRY_FTP,
      RETRY_LAST /* not used */
    } retry = RETRY_NO;
    long response = 0;
    if((CURLE_OPERATION_TIMEDOUT == result) ||
       (CURLE_COULDNT_RESOLVE_HOST == result) ||
       (CURLE_COULDNT_RESOLVE_PROXY == result) ||
       (CURLE_FTP_ACCEPT_TIMEOUT == result))
      /* retry timeout always */
      retry = RETRY_TIMEOUT;
    else if(config->retry_connrefused &&
            (CURLE_COULDNT_CONNECT == result)) {
      long oserrno = 0;
      curl_easy_getinfo(curl, CURLINFO_OS_ERRNO, &oserrno);
      if(SOCKECONNREFUSED == oserrno)
        retry = RETRY_CONNREFUSED;
    }
    else if((CURLE_OK == result) ||
            ((config->failonerror || config->failwithbody) &&
             (CURLE_HTTP_RETURNED_ERROR == result))) {
      /* If it returned OK. _or_ failonerror was enabled and it
         returned due to such an error, check for HTTP transient
         errors to retry on. */
      const char *scheme;
      curl_easy_getinfo(curl, CURLINFO_SCHEME, &scheme);
      scheme = proto_token(scheme);
      if(scheme == proto_http || scheme == proto_https) {
        /* This was HTTP(S) */
        curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);

        switch(response) {
        case 408: /* Request Timeout */
        case 429: /* Too Many Requests (RFC6585) */
        case 500: /* Internal Server Error */
        case 502: /* Bad Gateway */
        case 503: /* Service Unavailable */
        case 504: /* Gateway Timeout */
          retry = RETRY_HTTP;
          /*
           * At this point, we have already written data to the output
           * file (or terminal). If we write to a file, we must rewind
           * or close/re-open the file so that the next attempt starts
           * over from the beginning.
           *
           * For the upload case, we might need to start over reading from a
           * previous point if we have uploaded something when this was
           * returned.
           */
          break;
        }
      }
    } /* if CURLE_OK */
    else if(result) {
      const char *scheme;

      curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);
      curl_easy_getinfo(curl, CURLINFO_SCHEME, &scheme);
      scheme = proto_token(scheme);

      if((scheme == proto_ftp || scheme == proto_ftps) && response / 100 == 4)
        /*
         * This is typically when the FTP server only allows a certain
         * amount of users and we are not one of them. All 4xx codes
         * are transient.
         */
        retry = RETRY_FTP;
    }

    if(result && !retry && config->retry_all_errors)
      retry = RETRY_ALL_ERRORS;

    if(retry) {
      long sleeptime = 0;
      curl_off_t retry_after = 0;
      static const char * const m[]={
        NULL,
        "(retrying all errors)",
        ": timeout",
        ": connection refused",
        ": HTTP error",
        ": FTP error"
      };

      sleeptime = per->retry_sleep;
      if(RETRY_HTTP == retry) {
        curl_easy_getinfo(curl, CURLINFO_RETRY_AFTER, &retry_after);
        if(retry_after) {
          /* store in a 'long', make sure it does not overflow */
          if(retry_after > LONG_MAX/1000)
            sleeptime = LONG_MAX;
          else if((retry_after * 1000) > sleeptime)
            sleeptime = (long)retry_after * 1000; /* milliseconds */

          /* if adding retry_after seconds to the process would exceed the
             maximum time allowed for retrying, then exit the retries right
             away */
          if(config->retry_maxtime) {
            curl_off_t seconds = curlx_timediff(curlx_now(),
                                                per->retrystart)/1000;

            if((CURL_OFF_T_MAX - retry_after < seconds) ||
               (seconds + retry_after > config->retry_maxtime)) {
              warnf(config->global, "The Retry-After: time would "
                    "make this command line exceed the maximum allowed time "
                    "for retries.");
              goto noretry;
            }
          }
        }
      }
      warnf(config->global, "Problem %s. "
            "Will retry in %ld second%s. "
            "%ld retr%s left.",
            m[retry], sleeptime/1000L,
            (sleeptime/1000L == 1 ? "" : "s"),
            per->retry_remaining,
            (per->retry_remaining > 1 ? "ies" : "y"));

      per->retry_remaining--;
      if(!config->retry_delay) {
        per->retry_sleep *= 2;
        if(per->retry_sleep > RETRY_SLEEP_MAX)
          per->retry_sleep = RETRY_SLEEP_MAX;
      }
      if(outs->bytes && outs->filename && outs->stream) {
        /* We have written data to an output file, we truncate file
         */
        notef(config->global,
              "Throwing away %"  CURL_FORMAT_CURL_OFF_T " bytes",
              outs->bytes);
        fflush(outs->stream);
        /* truncate file at the position where we started appending */
#if defined(HAVE_FTRUNCATE) && !defined(__DJGPP__) && !defined(__AMIGA__) && \
  !defined(__MINGW32CE__)
        if(ftruncate(fileno(outs->stream), outs->init)) {
          /* when truncate fails, we cannot just append as then we will
             create something strange, bail out */
          errorf(config->global, "Failed to truncate file");
          return CURLE_WRITE_ERROR;
        }
        /* now seek to the end of the file, the position where we
           just truncated the file in a large file-safe way */
        rc = fseek(outs->stream, 0, SEEK_END);
#else
        /* ftruncate is not available, so just reposition the file
           to the location we would have truncated it. This will not
           work properly with large files on 32-bit systems, but
           most of those will have ftruncate. */
        rc = fseek(outs->stream, (long)outs->init, SEEK_SET);
#endif
        if(rc) {
          errorf(config->global, "Failed seeking to end of file");
          return CURLE_WRITE_ERROR;
        }
        outs->bytes = 0; /* clear for next round */
      }
      *retryp = TRUE;
      per->num_retries++;
      *delay = sleeptime;
      return CURLE_OK;
    }
  } /* if retry_remaining */
noretry:

  if((global->progressmode == CURL_PROGRESS_BAR) &&
     per->progressbar.calls)
    /* if the custom progress bar has been displayed, we output a
       newline here */
    fputs("\n", per->progressbar.out);

  /* Close the outs file */
  if(outs->fopened && outs->stream) {
    rc = fclose(outs->stream);
    if(!result && rc) {
      /* something went wrong in the writing process */
      result = CURLE_WRITE_ERROR;
      errorf(config->global, "curl: (%d) Failed writing body", result);
    }
    if(result && config->rm_partial) {
      struct_stat st;
      if(!stat(outs->filename, &st) &&
         S_ISREG(st.st_mode)) {
        if(!unlink(outs->filename))
          notef(global, "Removed output file: %s", outs->filename);
        else
          warnf(global, "Failed removing: %s", outs->filename);
      }
      else
        warnf(global, "Skipping removal; not a regular file: %s",
              outs->filename);
    }
  }

  /* File time can only be set _after_ the file has been closed */
  if(!result && config->remote_time && outs->s_isreg && outs->filename) {
    /* Ask libcurl if we got a remote file time */
    curl_off_t filetime = -1;
    curl_easy_getinfo(curl, CURLINFO_FILETIME_T, &filetime);
    setfiletime(filetime, outs->filename, global);
  }
skip:
  /* Write the --write-out data before cleanup but after result is final */
  if(config->writeout)
    ourWriteOut(config, per, result);

  /* Close function-local opened file descriptors */
  if(per->heads.fopened && per->heads.stream)
    fclose(per->heads.stream);

  if(per->heads.alloc_filename)
    curlx_safefree(per->heads.filename);

  if(per->etag_save.fopened && per->etag_save.stream)
    fclose(per->etag_save.stream);

  if(per->etag_save.alloc_filename)
    curlx_safefree(per->etag_save.filename);

  curl_easy_cleanup(per->curl);
  if(outs->alloc_filename)
    free(outs->filename);
  free(per->url);
  free(per->outfile);
  free(per->uploadfile);
  if(global->parallel)
    free(per->errorbuffer);
  curl_slist_free_all(per->hdrcbdata.headlist);
  per->hdrcbdata.headlist = NULL;
  return result;
}